

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

void __thiscall
rengine::Signal<>::disconnect(Signal<> *this,SignalEmitter *emitter,SignalHandler<> *handler)

{
  uint __line;
  Bucket *pBVar1;
  __normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
  __position;
  char *__assertion;
  SignalHandler<> *local_18;
  SignalHandler<> *handler_local;
  
  local_18 = handler;
  pBVar1 = findBucket(this,emitter);
  if (pBVar1 == (Bucket *)0x0) {
    __assertion = "bucket";
    __line = 0x74;
  }
  else {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<rengine::SignalHandler<>**,std::vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>>>,__gnu_cxx::__ops::_Iter_equals_val<rengine::SignalHandler<>*const>>
                           ((pBVar1->handlers).
                            super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (pBVar1->handlers).
                            super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_18);
    if (__position._M_current !=
        (pBVar1->handlers).
        super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::erase
                (&pBVar1->handlers,(const_iterator)__position._M_current);
      return;
    }
    __assertion = "pos != bucket->handlers.end()";
    __line = 0x76;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/object/signal.h"
                ,__line,
                "void rengine::Signal<>::disconnect(SignalEmitter *, SignalHandler<Arguments...> *) [Arguments = <>]"
               );
}

Assistant:

void disconnect(SignalEmitter *emitter, SignalHandler<Arguments ...> *handler)
    {
        Bucket *bucket = findBucket(emitter);
        assert(bucket);
        auto pos = std::find(bucket->handlers.begin(), bucket->handlers.end(), handler);
        assert(pos != bucket->handlers.end());
        bucket->handlers.erase(pos);
    }